

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBufferPool.cpp
# Opt level: O0

VkCommandBuffer __thiscall
VulkanUtilities::VulkanCommandBufferPool::GetCommandBuffer
          (VulkanCommandBufferPool *this,char *DebugName)

{
  bool bVar1;
  VkResult VVar2;
  reference ppVVar3;
  Char *pCVar4;
  element_type *this_00;
  undefined1 local_e8 [8];
  string msg_2;
  undefined1 local_c0 [4];
  VkResult err;
  VkCommandBufferBeginInfo CmdBuffBeginInfo;
  string msg_1;
  VkCommandBufferAllocateInfo BuffAllocInfo;
  string msg;
  VkResult err_1;
  lock_guard<std::mutex> Lock;
  VkCommandBuffer CmdBuffer;
  char *DebugName_local;
  VulkanCommandBufferPool *this_local;
  
  Lock._M_device = (mutex_type *)0x0;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffd8,&this->m_Mutex);
  bVar1 = std::deque<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::empty
                    (&this->m_CmdBuffers);
  if (!bVar1) {
    ppVVar3 = std::deque<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::front
                        (&this->m_CmdBuffers);
    Lock._M_device = (mutex_type *)*ppVVar3;
    VVar2 = (*vkResetCommandBuffer)((VkCommandBuffer)Lock._M_device,0);
    if (VVar2 != VK_SUCCESS) {
      Diligent::FormatString<char[31]>
                ((string *)&BuffAllocInfo.level,(char (*) [31])"Failed to reset command buffer");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      Diligent::DebugAssertionFailed
                (pCVar4,"GetCommandBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBufferPool.cpp"
                 ,0x52);
      std::__cxx11::string::~string((string *)&BuffAllocInfo.level);
    }
    std::deque<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::pop_front
              (&this->m_CmdBuffers);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffd8);
  if (Lock._M_device == (mutex_type *)0x0) {
    memset((void *)((long)&msg_1.field_2 + 8),0,0x20);
    msg_1.field_2._8_4_ = 0x28;
    BuffAllocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    BuffAllocInfo._4_4_ = 0;
    BuffAllocInfo.pNext =
         VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkCommandPool_T_
                   ((VulkanObjectWrapper *)&this->m_CmdPool);
    BuffAllocInfo.commandPool._0_4_ = 0;
    BuffAllocInfo.commandPool._4_4_ = 1;
    this_00 = std::
              __shared_ptr_access<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    Lock._M_device =
         (mutex_type *)
         VulkanLogicalDevice::AllocateVkCommandBuffer
                   (this_00,(VkCommandBufferAllocateInfo *)((long)&msg_1.field_2 + 8),"");
    if ((VkCommandBuffer)Lock._M_device == (VkCommandBuffer)0x0) {
      Diligent::FormatString<char[41]>
                ((string *)&CmdBuffBeginInfo.pInheritanceInfo,
                 (char (*) [41])"Failed to allocate vulkan command buffer");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      Diligent::DebugAssertionFailed
                (pCVar4,"GetCommandBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBufferPool.cpp"
                 ,100);
      std::__cxx11::string::~string((string *)&CmdBuffBeginInfo.pInheritanceInfo);
    }
  }
  memset(local_c0,0,0x20);
  local_c0 = (undefined1  [4])0x2a;
  CmdBuffBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  CmdBuffBeginInfo._4_4_ = 0;
  CmdBuffBeginInfo.pNext._0_4_ = 1;
  CmdBuffBeginInfo.flags = 0;
  CmdBuffBeginInfo._20_4_ = 0;
  msg_2.field_2._12_4_ =
       (*vkBeginCommandBuffer)((VkCommandBuffer)Lock._M_device,(VkCommandBufferBeginInfo *)local_c0)
  ;
  if (msg_2.field_2._12_4_ != VK_SUCCESS) {
    Diligent::FormatString<char[31]>
              ((string *)local_e8,(char (*) [31])"Failed to begin command buffer");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar4,"GetCommandBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBufferPool.cpp"
               ,0x71);
    std::__cxx11::string::~string((string *)local_e8);
  }
  std::__atomic_base<int>::operator++(&(this->m_BuffCounter).super___atomic_base<int>);
  return (VkCommandBuffer)Lock._M_device;
}

Assistant:

VkCommandBuffer VulkanCommandBufferPool::GetCommandBuffer(const char* DebugName)
{
    VkCommandBuffer CmdBuffer = VK_NULL_HANDLE;

    {
        std::lock_guard<std::mutex> Lock{m_Mutex};

        if (!m_CmdBuffers.empty())
        {
            CmdBuffer = m_CmdBuffers.front();
            auto err  = vkResetCommandBuffer(
                CmdBuffer,
                0 // VK_COMMAND_BUFFER_RESET_RELEASE_RESOURCES_BIT -  specifies that most or all memory resources currently
                  // owned by the command buffer should be returned to the parent command pool.
            );
            DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to reset command buffer");
            (void)err;
            m_CmdBuffers.pop_front();
        }
    }

    // If no cmd buffers were ready to be reused, create a new one
    if (CmdBuffer == VK_NULL_HANDLE)
    {
        VkCommandBufferAllocateInfo BuffAllocInfo = {};

        BuffAllocInfo.sType              = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
        BuffAllocInfo.pNext              = nullptr;
        BuffAllocInfo.commandPool        = m_CmdPool;
        BuffAllocInfo.level              = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
        BuffAllocInfo.commandBufferCount = 1;

        CmdBuffer = m_LogicalDevice->AllocateVkCommandBuffer(BuffAllocInfo);
        DEV_CHECK_ERR(CmdBuffer != VK_NULL_HANDLE, "Failed to allocate vulkan command buffer");
    }

    VkCommandBufferBeginInfo CmdBuffBeginInfo = {};

    CmdBuffBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
    CmdBuffBeginInfo.pNext = nullptr;
    CmdBuffBeginInfo.flags = VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT; // Each recording of the command buffer will only be
                                                                          // submitted once, and the command buffer will be reset
                                                                          // and recorded again between each submission.
    CmdBuffBeginInfo.pInheritanceInfo = nullptr;                          // Ignored for a primary command buffer

    auto err = vkBeginCommandBuffer(CmdBuffer, &CmdBuffBeginInfo);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to begin command buffer");
    (void)err;
#ifdef DILIGENT_DEVELOPMENT
    ++m_BuffCounter;
#endif
    return CmdBuffer;
}